

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::constant_expression_vector_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstant *c,uint32_t vector)

{
  __node_base_ptr *this_00;
  uint64_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  int32_t iVar6;
  SPIRType *pSVar7;
  uint64_t uVar8;
  int64_t iVar9;
  CompilerError *pCVar10;
  int32_t value;
  int32_t value_00;
  char *pcVar11;
  byte local_cc2;
  byte local_c8e;
  bool local_b51;
  bool local_b49;
  string local_b28;
  uint local_b08;
  int8_t local_b01;
  uint32_t i_14;
  string local_ae0 [32];
  string local_ac0;
  uint local_aa0;
  int8_t local_a99;
  uint32_t i_13;
  uint8_t local_a71;
  string local_a70;
  string local_a50 [32];
  string local_a30;
  uint local_a10;
  uint8_t local_a09;
  uint32_t i_12;
  int16_t local_9e2;
  string local_9e0;
  string local_9c0 [38];
  int16_t local_99a;
  string local_998;
  string local_978;
  uint local_958;
  int16_t local_952;
  uint32_t i_11;
  uint16_t local_92a;
  string local_928;
  string local_908 [38];
  uint16_t local_8e2;
  string local_8e0;
  string local_8c0;
  uint local_8a0;
  uint32_t local_89c;
  uint32_t i_10;
  string local_878;
  string local_858;
  uint local_834;
  undefined1 local_830 [4];
  uint32_t i_9;
  byte local_80b;
  byte local_80a;
  allocator local_809;
  string local_808;
  uint32_t local_7e4;
  string local_7e0;
  string local_7c0;
  uint local_7a0;
  byte local_79b;
  byte local_79a;
  allocator local_799;
  uint32_t i_8;
  uint32_t local_774;
  string local_770;
  uint64_t local_750;
  string local_748;
  string local_728;
  uint local_704;
  uint64_t uStack_700;
  uint32_t i_7;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  uint local_694;
  undefined1 local_690 [4];
  uint32_t i_6;
  undefined1 local_670 [8];
  string int64_type;
  SPIRType tmp;
  string local_4d0;
  uint local_4ac;
  undefined1 local_4a8 [4];
  uint32_t i_5;
  string local_488;
  string local_468;
  string local_448;
  uint local_424;
  undefined1 local_420 [4];
  uint32_t i_4;
  string local_400;
  string local_3e0;
  string local_3c0;
  uint local_39c;
  undefined1 local_398 [4];
  uint32_t i_3;
  string local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  uint local_314;
  uint32_t local_310;
  uint32_t i_2;
  uint32_t ident_1;
  uint32_t i_1;
  uint64_t ident;
  bool local_2f7;
  bool local_2f6;
  undefined1 local_2f5;
  uint32_t i;
  bool swizzle_splat;
  bool splat;
  undefined1 local_2e8 [8];
  SPIRType scalar_type;
  SPIRType type;
  uint32_t vector_local;
  SPIRConstant *c_local;
  CompilerGLSL *this_local;
  string *res;
  
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(c->super_IVariant).field_0xc);
  pSVar7 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
  this_00 = &scalar_type.member_name_cache._M_h._M_single_bucket;
  SPIRType::SPIRType((SPIRType *)this_00,pSVar7);
  SPIRType::SPIRType((SPIRType *)local_2e8,(SPIRType *)this_00);
  scalar_type.basetype = Void;
  local_2f5 = 0;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_b49 = false;
  if (((this->backend).use_constructor_splatting & 1U) != 0) {
    uVar3 = SPIRConstant::vector_size(c);
    local_b49 = 1 < uVar3;
  }
  local_2f6 = local_b49;
  local_b51 = false;
  if (((this->backend).can_swizzle_scalar & 1U) != 0) {
    uVar3 = SPIRConstant::vector_size(c);
    local_b51 = 1 < uVar3;
  }
  local_2f7 = local_b51;
  bVar2 = type_is_floating_point((SPIRType *)&scalar_type.member_name_cache._M_h._M_single_bucket);
  if (!bVar2) {
    local_2f7 = false;
  }
  if (((local_2f6 & 1U) != 0) || ((local_2f7 & 1U) != 0)) {
    for (ident._4_4_ = 0; uVar5 = ident._4_4_, uVar3 = SPIRConstant::vector_size(c), uVar5 < uVar3;
        ident._4_4_ = ident._4_4_ + 1) {
      uVar3 = SPIRConstant::specialization_constant_id(c,vector,ident._4_4_);
      if (uVar3 != 0) {
        local_2f6 = false;
        local_2f7 = false;
        break;
      }
    }
  }
  if (((local_2f6 & 1U) != 0) || ((local_2f7 & 1U) != 0)) {
    if (type.super_IVariant._12_4_ == 0x40) {
      _ident_1 = SPIRConstant::scalar_u64(c,vector,0);
      for (i_2 = 1; uVar3 = i_2, uVar4 = SPIRConstant::vector_size(c), uVar1 = _ident_1,
          uVar3 < uVar4; i_2 = i_2 + 1) {
        uVar8 = SPIRConstant::scalar_u64(c,vector,i_2);
        if (uVar1 != uVar8) {
          local_2f6 = false;
          local_2f7 = false;
          break;
        }
      }
    }
    else {
      local_310 = SPIRConstant::scalar(c,vector,0);
      for (local_314 = 1; uVar5 = local_314, uVar4 = SPIRConstant::vector_size(c), uVar3 = local_310
          , uVar5 < uVar4; local_314 = local_314 + 1) {
        uVar4 = SPIRConstant::scalar(c,vector,local_314);
        if (uVar3 != uVar4) {
          local_2f6 = false;
          local_2f7 = false;
        }
      }
    }
  }
  uVar3 = SPIRConstant::vector_size(c);
  if ((1 < uVar3) && ((local_2f7 & 1U) == 0)) {
    (*(this->super_Compiler)._vptr_Compiler[0x13])
              (&local_358,this,&scalar_type.member_name_cache._M_h._M_single_bucket,0);
    ::std::operator+(&local_338,&local_358,"(");
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_338);
    ::std::__cxx11::string::~string((string *)&local_338);
    ::std::__cxx11::string::~string((string *)&local_358);
  }
  switch(type.super_IVariant.self.id) {
  case 2:
    if ((local_2f6 & 1U) == 0) {
      for (local_b08 = 0; uVar5 = local_b08, uVar3 = SPIRConstant::vector_size(c), uVar5 < uVar3;
          local_b08 = local_b08 + 1) {
        uVar3 = SPIRConstant::vector_size(c);
        if ((uVar3 < 2) ||
           (uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_b08), uVar3 == 0)) {
          uVar3 = SPIRConstant::scalar(c,vector,local_b08);
          pcVar11 = "false";
          if (uVar3 != 0) {
            pcVar11 = "true";
          }
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar11);
        }
        else {
          uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_b08);
          to_expression_abi_cxx11_(&local_b28,this,uVar3,true);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b28);
          ::std::__cxx11::string::~string((string *)&local_b28);
        }
        uVar5 = local_b08 + 1;
        uVar3 = SPIRConstant::vector_size(c);
        if (uVar5 < uVar3) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
      }
    }
    else {
      uVar3 = SPIRConstant::scalar(c,vector,0);
      pcVar11 = "false";
      if (uVar3 != 0) {
        pcVar11 = "true";
      }
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar11);
    }
    break;
  case 3:
    if ((local_2f6 & 1U) == 0) {
      for (local_aa0 = 0; uVar5 = local_aa0, uVar3 = SPIRConstant::vector_size(c), uVar5 < uVar3;
          local_aa0 = local_aa0 + 1) {
        uVar3 = SPIRConstant::vector_size(c);
        if ((uVar3 < 2) ||
           (uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_aa0), uVar3 == 0)) {
          (*(this->super_Compiler)._vptr_Compiler[0x13])(local_ae0,this,local_2e8,0);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_ae0);
          ::std::__cxx11::string::~string(local_ae0);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(");
          local_b01 = SPIRConstant::scalar_i8(c,vector,local_aa0);
          convert_to_string<signed_char,_0>((string *)&i_14,&local_b01);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&i_14);
          ::std::__cxx11::string::~string((string *)&i_14);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
        }
        else {
          uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_aa0);
          to_expression_abi_cxx11_(&local_ac0,this,uVar3,true);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_ac0);
          ::std::__cxx11::string::~string((string *)&local_ac0);
        }
        uVar5 = local_aa0 + 1;
        uVar3 = SPIRConstant::vector_size(c);
        if (uVar5 < uVar3) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
      }
    }
    else {
      local_a99 = SPIRConstant::scalar_i8(c,vector,0);
      convert_to_string<signed_char,_0>((string *)&i_13,&local_a99);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&i_13);
      ::std::__cxx11::string::~string((string *)&i_13);
    }
    break;
  case 4:
    if ((local_2f6 & 1U) == 0) {
      for (local_a10 = 0; uVar5 = local_a10, uVar3 = SPIRConstant::vector_size(c), uVar5 < uVar3;
          local_a10 = local_a10 + 1) {
        uVar3 = SPIRConstant::vector_size(c);
        if ((uVar3 < 2) ||
           (uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_a10), uVar3 == 0)) {
          (*(this->super_Compiler)._vptr_Compiler[0x13])(local_a50,this,local_2e8,0);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_a50);
          ::std::__cxx11::string::~string(local_a50);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(");
          local_a71 = SPIRConstant::scalar_u8(c,vector,local_a10);
          convert_to_string<unsigned_char,_0>(&local_a70,&local_a71);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_a70);
          ::std::__cxx11::string::~string((string *)&local_a70);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
        }
        else {
          uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_a10);
          to_expression_abi_cxx11_(&local_a30,this,uVar3,true);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_a30);
          ::std::__cxx11::string::~string((string *)&local_a30);
        }
        uVar5 = local_a10 + 1;
        uVar3 = SPIRConstant::vector_size(c);
        if (uVar5 < uVar3) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
      }
    }
    else {
      local_a09 = SPIRConstant::scalar_u8(c,vector,0);
      convert_to_string<unsigned_char,_0>((string *)&i_12,&local_a09);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&i_12);
      ::std::__cxx11::string::~string((string *)&i_12);
    }
    break;
  case 5:
    if ((local_2f6 & 1U) == 0) {
      for (local_958 = 0; uVar5 = local_958, uVar3 = SPIRConstant::vector_size(c), uVar5 < uVar3;
          local_958 = local_958 + 1) {
        uVar3 = SPIRConstant::vector_size(c);
        if ((uVar3 < 2) ||
           (uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_958), uVar3 == 0)) {
          if (*(this->backend).int16_t_literal_suffix == '\0') {
            (*(this->super_Compiler)._vptr_Compiler[0x13])(local_9c0,this,local_2e8,0);
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_9c0);
            ::std::__cxx11::string::~string(local_9c0);
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(");
            local_9e2 = SPIRConstant::scalar_i16(c,vector,local_958);
            convert_to_string<short,_0>(&local_9e0,&local_9e2);
            ::std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,(string *)&local_9e0);
            ::std::__cxx11::string::~string((string *)&local_9e0);
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
          }
          else {
            local_99a = SPIRConstant::scalar_i16(c,vector,local_958);
            convert_to_string<short,_0>(&local_998,&local_99a);
            ::std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,(string *)&local_998);
            ::std::__cxx11::string::~string((string *)&local_998);
            ::std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,(this->backend).int16_t_literal_suffix);
          }
        }
        else {
          uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_958);
          to_expression_abi_cxx11_(&local_978,this,uVar3,true);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_978);
          ::std::__cxx11::string::~string((string *)&local_978);
        }
        uVar5 = local_958 + 1;
        uVar3 = SPIRConstant::vector_size(c);
        if (uVar5 < uVar3) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
      }
    }
    else {
      local_952 = SPIRConstant::scalar_i16(c,vector,0);
      convert_to_string<short,_0>((string *)&i_11,&local_952);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&i_11);
      ::std::__cxx11::string::~string((string *)&i_11);
    }
    break;
  case 6:
    if ((local_2f6 & 1U) == 0) {
      for (local_8a0 = 0; uVar5 = local_8a0, uVar3 = SPIRConstant::vector_size(c), uVar5 < uVar3;
          local_8a0 = local_8a0 + 1) {
        uVar3 = SPIRConstant::vector_size(c);
        if ((uVar3 < 2) ||
           (uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_8a0), uVar3 == 0)) {
          if (*(this->backend).uint16_t_literal_suffix == '\0') {
            (*(this->super_Compiler)._vptr_Compiler[0x13])(local_908,this,local_2e8,0);
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_908);
            ::std::__cxx11::string::~string(local_908);
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(");
            local_92a = SPIRConstant::scalar_u16(c,vector,local_8a0);
            convert_to_string<unsigned_short,_0>(&local_928,&local_92a);
            ::std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,(string *)&local_928);
            ::std::__cxx11::string::~string((string *)&local_928);
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
          }
          else {
            local_8e2 = SPIRConstant::scalar_u16(c,vector,local_8a0);
            convert_to_string<unsigned_short,_0>(&local_8e0,&local_8e2);
            ::std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,(string *)&local_8e0);
            ::std::__cxx11::string::~string((string *)&local_8e0);
            ::std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,(this->backend).uint16_t_literal_suffix);
          }
        }
        else {
          uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_8a0);
          to_expression_abi_cxx11_(&local_8c0,this,uVar3,true);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_8c0);
          ::std::__cxx11::string::~string((string *)&local_8c0);
        }
        uVar5 = local_8a0 + 1;
        uVar3 = SPIRConstant::vector_size(c);
        if (uVar5 < uVar3) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
      }
    }
    else {
      local_89c = SPIRConstant::scalar(c,vector,0);
      convert_to_string<unsigned_int,_0>((string *)&i_10,&local_89c);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&i_10);
      ::std::__cxx11::string::~string((string *)&i_10);
    }
    break;
  case 7:
    if ((local_2f6 & 1U) == 0) {
      for (local_834 = 0; uVar5 = local_834, uVar3 = SPIRConstant::vector_size(c), uVar5 < uVar3;
          local_834 = local_834 + 1) {
        uVar3 = SPIRConstant::vector_size(c);
        if ((uVar3 < 2) ||
           (uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_834), uVar3 == 0)) {
          uVar5 = SPIRConstant::scalar_i32(c,vector,local_834);
          convert_to_string_abi_cxx11_(&local_878,(spirv_cross *)(ulong)uVar5,value_00);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_878);
          ::std::__cxx11::string::~string((string *)&local_878);
        }
        else {
          uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_834);
          to_expression_abi_cxx11_(&local_858,this,uVar3,true);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_858);
          ::std::__cxx11::string::~string((string *)&local_858);
        }
        uVar5 = local_834 + 1;
        uVar3 = SPIRConstant::vector_size(c);
        if (uVar5 < uVar3) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
      }
    }
    else {
      uVar5 = SPIRConstant::scalar_i32(c,vector,0);
      convert_to_string_abi_cxx11_((string *)local_830,(spirv_cross *)(ulong)uVar5,value);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_830);
      ::std::__cxx11::string::~string((string *)local_830);
    }
    break;
  case 8:
    if ((local_2f6 & 1U) == 0) {
      for (local_7a0 = 0; uVar5 = local_7a0, uVar3 = SPIRConstant::vector_size(c), uVar5 < uVar3;
          local_7a0 = local_7a0 + 1) {
        uVar3 = SPIRConstant::vector_size(c);
        if ((uVar3 < 2) ||
           (uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_7a0), uVar3 == 0)) {
          local_7e4 = SPIRConstant::scalar(c,vector,local_7a0);
          convert_to_string<unsigned_int,_0>(&local_7e0,&local_7e4);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_7e0);
          ::std::__cxx11::string::~string((string *)&local_7e0);
          local_80a = 0;
          local_80b = 0;
          bVar2 = is_legacy(this);
          local_cc2 = 0;
          if (bVar2) {
            ::std::allocator<char>::allocator();
            local_80a = 1;
            ::std::__cxx11::string::string((string *)&local_808,"GL_EXT_gpu_shader4",&local_809);
            local_80b = 1;
            bVar2 = has_extension(this,&local_808);
            local_cc2 = bVar2 ^ 0xff;
          }
          if ((local_80b & 1) != 0) {
            ::std::__cxx11::string::~string((string *)&local_808);
          }
          if ((local_80a & 1) != 0) {
            ::std::allocator<char>::~allocator((allocator<char> *)&local_809);
          }
          if ((local_cc2 & 1) == 0) {
            if (((this->backend).uint32_t_literal_suffix & 1U) != 0) {
              ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"u");
            }
          }
          else {
            iVar6 = SPIRConstant::scalar_i32(c,vector,local_7a0);
            if (iVar6 < 0) {
              pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError
                        (pCVar10,
                         "Tried to convert uint literal into int, but this made the literal negative."
                        );
              __cxa_throw(pCVar10,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
          }
        }
        else {
          uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_7a0);
          to_expression_abi_cxx11_(&local_7c0,this,uVar3,true);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_7c0);
          ::std::__cxx11::string::~string((string *)&local_7c0);
        }
        uVar5 = local_7a0 + 1;
        uVar3 = SPIRConstant::vector_size(c);
        if (uVar5 < uVar3) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
      }
    }
    else {
      local_774 = SPIRConstant::scalar(c,vector,0);
      convert_to_string<unsigned_int,_0>(&local_770,&local_774);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_770);
      ::std::__cxx11::string::~string((string *)&local_770);
      local_79a = 0;
      local_79b = 0;
      bVar2 = is_legacy(this);
      local_c8e = 0;
      if (bVar2) {
        ::std::allocator<char>::allocator();
        local_79a = 1;
        ::std::__cxx11::string::string((string *)&i_8,"GL_EXT_gpu_shader4",&local_799);
        local_79b = 1;
        bVar2 = has_extension(this,(string *)&i_8);
        local_c8e = bVar2 ^ 0xff;
      }
      if ((local_79b & 1) != 0) {
        ::std::__cxx11::string::~string((string *)&i_8);
      }
      if ((local_79a & 1) != 0) {
        ::std::allocator<char>::~allocator((allocator<char> *)&local_799);
      }
      if ((local_c8e & 1) == 0) {
        if (((this->backend).uint32_t_literal_suffix & 1U) != 0) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"u");
        }
      }
      else {
        iVar6 = SPIRConstant::scalar_i32(c,vector,0);
        if (iVar6 < 0) {
          pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar10,
                     "Tried to convert uint literal into int, but this made the literal negative.");
          __cxa_throw(pCVar10,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
      }
    }
    break;
  case 9:
    SPIRType::SPIRType((SPIRType *)((long)&int64_type.field_2 + 8),
                       (SPIRType *)&scalar_type.member_name_cache._M_h._M_single_bucket);
    tmp.basetype = Void;
    tmp.width = 1;
    (*(this->super_Compiler)._vptr_Compiler[0x13])
              (local_670,this,(undefined1 *)((long)&int64_type.field_2 + 8),0);
    if ((local_2f6 & 1U) == 0) {
      for (local_694 = 0; uVar5 = local_694, uVar3 = SPIRConstant::vector_size(c), uVar5 < uVar3;
          local_694 = local_694 + 1) {
        uVar3 = SPIRConstant::vector_size(c);
        if ((uVar3 < 2) ||
           (uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_694), uVar3 == 0)) {
          iVar9 = SPIRConstant::scalar_i64(c,vector,local_694);
          convert_to_string(&local_6d8,iVar9,(string *)local_670,
                            (bool)((this->backend).long_long_literal_suffix & 1));
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_6d8);
          ::std::__cxx11::string::~string((string *)&local_6d8);
        }
        else {
          uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_694);
          to_expression_abi_cxx11_(&local_6b8,this,uVar3,true);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_6b8);
          ::std::__cxx11::string::~string((string *)&local_6b8);
        }
        uVar5 = local_694 + 1;
        uVar3 = SPIRConstant::vector_size(c);
        if (uVar5 < uVar3) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
      }
    }
    else {
      iVar9 = SPIRConstant::scalar_i64(c,vector,0);
      convert_to_string((string *)local_690,iVar9,(string *)local_670,
                        (bool)((this->backend).long_long_literal_suffix & 1));
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_690);
      ::std::__cxx11::string::~string((string *)local_690);
    }
    ::std::__cxx11::string::~string((string *)local_670);
    SPIRType::~SPIRType((SPIRType *)((long)&int64_type.field_2 + 8));
    break;
  case 10:
    if ((local_2f6 & 1U) == 0) {
      for (local_704 = 0; uVar5 = local_704, uVar3 = SPIRConstant::vector_size(c), uVar5 < uVar3;
          local_704 = local_704 + 1) {
        uVar3 = SPIRConstant::vector_size(c);
        if ((uVar3 < 2) ||
           (uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_704), uVar3 == 0)) {
          local_750 = SPIRConstant::scalar_u64(c,vector,local_704);
          convert_to_string<unsigned_long,_0>(&local_748,&local_750);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_748);
          ::std::__cxx11::string::~string((string *)&local_748);
          if (((this->backend).long_long_literal_suffix & 1U) == 0) {
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"ul");
          }
          else {
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"ull");
          }
        }
        else {
          uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_704);
          to_expression_abi_cxx11_(&local_728,this,uVar3,true);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_728);
          ::std::__cxx11::string::~string((string *)&local_728);
        }
        uVar5 = local_704 + 1;
        uVar3 = SPIRConstant::vector_size(c);
        if (uVar5 < uVar3) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
      }
    }
    else {
      uStack_700 = SPIRConstant::scalar_u64(c,vector,0);
      convert_to_string<unsigned_long,_0>(&local_6f8,&stack0xfffffffffffff900);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_6f8);
      ::std::__cxx11::string::~string((string *)&local_6f8);
      if (((this->backend).long_long_literal_suffix & 1U) == 0) {
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"ul");
      }
      else {
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"ull");
      }
    }
    break;
  default:
    pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar10,"Invalid constant expression basetype.");
    __cxa_throw(pCVar10,&CompilerError::typeinfo,CompilerError::~CompilerError);
  case 0xc:
    if (((local_2f6 & 1U) == 0) && ((local_2f7 & 1U) == 0)) {
      for (local_39c = 0; uVar5 = local_39c, uVar3 = SPIRConstant::vector_size(c), uVar5 < uVar3;
          local_39c = local_39c + 1) {
        uVar3 = SPIRConstant::vector_size(c);
        if ((uVar3 < 2) ||
           (uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_39c), uVar3 == 0)) {
          convert_half_to_string_abi_cxx11_(&local_3e0,this,c,vector,local_39c);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_3e0);
          ::std::__cxx11::string::~string((string *)&local_3e0);
        }
        else {
          uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_39c);
          to_expression_abi_cxx11_(&local_3c0,this,uVar3,true);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_3c0);
          ::std::__cxx11::string::~string((string *)&local_3c0);
        }
        uVar5 = local_39c + 1;
        uVar3 = SPIRConstant::vector_size(c);
        if (uVar5 < uVar3) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
      }
    }
    else {
      convert_half_to_string_abi_cxx11_(&local_378,this,c,vector,0);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_378);
      ::std::__cxx11::string::~string((string *)&local_378);
      if ((local_2f7 & 1U) != 0) {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(c->super_IVariant).field_0xc);
        pSVar7 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
        remap_swizzle((string *)local_398,this,pSVar7,1,__return_storage_ptr__);
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_398);
        ::std::__cxx11::string::~string((string *)local_398);
      }
    }
    break;
  case 0xd:
    if (((local_2f6 & 1U) == 0) && ((local_2f7 & 1U) == 0)) {
      for (local_424 = 0; uVar5 = local_424, uVar3 = SPIRConstant::vector_size(c), uVar5 < uVar3;
          local_424 = local_424 + 1) {
        uVar3 = SPIRConstant::vector_size(c);
        if ((uVar3 < 2) ||
           (uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_424), uVar3 == 0)) {
          convert_float_to_string_abi_cxx11_(&local_468,this,c,vector,local_424);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_468);
          ::std::__cxx11::string::~string((string *)&local_468);
        }
        else {
          uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_424);
          to_expression_abi_cxx11_(&local_448,this,uVar3,true);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_448);
          ::std::__cxx11::string::~string((string *)&local_448);
        }
        uVar5 = local_424 + 1;
        uVar3 = SPIRConstant::vector_size(c);
        if (uVar5 < uVar3) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
      }
    }
    else {
      convert_float_to_string_abi_cxx11_(&local_400,this,c,vector,0);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_400);
      ::std::__cxx11::string::~string((string *)&local_400);
      if ((local_2f7 & 1U) != 0) {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(c->super_IVariant).field_0xc);
        pSVar7 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
        remap_swizzle((string *)local_420,this,pSVar7,1,__return_storage_ptr__);
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_420);
        ::std::__cxx11::string::~string((string *)local_420);
      }
    }
    break;
  case 0xe:
    if (((local_2f6 & 1U) == 0) && ((local_2f7 & 1U) == 0)) {
      for (local_4ac = 0; uVar5 = local_4ac, uVar3 = SPIRConstant::vector_size(c), uVar5 < uVar3;
          local_4ac = local_4ac + 1) {
        uVar3 = SPIRConstant::vector_size(c);
        if ((uVar3 < 2) ||
           (uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_4ac), uVar3 == 0)) {
          convert_double_to_string_abi_cxx11_
                    ((string *)&tmp.member_name_cache._M_h._M_single_bucket,this,c,vector,local_4ac)
          ;
          ::std::__cxx11::string::operator+=
                    ((string *)__return_storage_ptr__,
                     (string *)&tmp.member_name_cache._M_h._M_single_bucket);
          ::std::__cxx11::string::~string((string *)&tmp.member_name_cache._M_h._M_single_bucket);
        }
        else {
          uVar3 = SPIRConstant::specialization_constant_id(c,vector,local_4ac);
          to_expression_abi_cxx11_(&local_4d0,this,uVar3,true);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_4d0);
          ::std::__cxx11::string::~string((string *)&local_4d0);
        }
        uVar5 = local_4ac + 1;
        uVar3 = SPIRConstant::vector_size(c);
        if (uVar5 < uVar3) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
      }
    }
    else {
      convert_double_to_string_abi_cxx11_(&local_488,this,c,vector,0);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_488);
      ::std::__cxx11::string::~string((string *)&local_488);
      if ((local_2f7 & 1U) != 0) {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(c->super_IVariant).field_0xc);
        pSVar7 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
        remap_swizzle((string *)local_4a8,this,pSVar7,1,__return_storage_ptr__);
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_4a8);
        ::std::__cxx11::string::~string((string *)local_4a8);
      }
    }
  }
  uVar3 = SPIRConstant::vector_size(c);
  if ((1 < uVar3) && ((local_2f7 & 1U) == 0)) {
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
  }
  local_2f5 = 1;
  SPIRType::~SPIRType((SPIRType *)local_2e8);
  SPIRType::~SPIRType((SPIRType *)&scalar_type.member_name_cache._M_h._M_single_bucket);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::constant_expression_vector(const SPIRConstant &c, uint32_t vector)
{
	auto type = get<SPIRType>(c.constant_type);
	type.columns = 1;

	auto scalar_type = type;
	scalar_type.vecsize = 1;

	string res;
	bool splat = backend.use_constructor_splatting && c.vector_size() > 1;
	bool swizzle_splat = backend.can_swizzle_scalar && c.vector_size() > 1;

	if (!type_is_floating_point(type))
	{
		// Cannot swizzle literal integers as a special case.
		swizzle_splat = false;
	}

	if (splat || swizzle_splat)
	{
		// Cannot use constant splatting if we have specialization constants somewhere in the vector.
		for (uint32_t i = 0; i < c.vector_size(); i++)
		{
			if (c.specialization_constant_id(vector, i) != 0)
			{
				splat = false;
				swizzle_splat = false;
				break;
			}
		}
	}

	if (splat || swizzle_splat)
	{
		if (type.width == 64)
		{
			uint64_t ident = c.scalar_u64(vector, 0);
			for (uint32_t i = 1; i < c.vector_size(); i++)
			{
				if (ident != c.scalar_u64(vector, i))
				{
					splat = false;
					swizzle_splat = false;
					break;
				}
			}
		}
		else
		{
			uint32_t ident = c.scalar(vector, 0);
			for (uint32_t i = 1; i < c.vector_size(); i++)
			{
				if (ident != c.scalar(vector, i))
				{
					splat = false;
					swizzle_splat = false;
				}
			}
		}
	}

	if (c.vector_size() > 1 && !swizzle_splat)
		res += type_to_glsl(type) + "(";

	switch (type.basetype)
	{
	case SPIRType::Half:
		if (splat || swizzle_splat)
		{
			res += convert_half_to_string(c, vector, 0);
			if (swizzle_splat)
				res = remap_swizzle(get<SPIRType>(c.constant_type), 1, res);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_half_to_string(c, vector, i);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Float:
		if (splat || swizzle_splat)
		{
			res += convert_float_to_string(c, vector, 0);
			if (swizzle_splat)
				res = remap_swizzle(get<SPIRType>(c.constant_type), 1, res);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_float_to_string(c, vector, i);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Double:
		if (splat || swizzle_splat)
		{
			res += convert_double_to_string(c, vector, 0);
			if (swizzle_splat)
				res = remap_swizzle(get<SPIRType>(c.constant_type), 1, res);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_double_to_string(c, vector, i);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Int64:
	{
		auto tmp = type;
		tmp.vecsize = 1;
		tmp.columns = 1;
		auto int64_type = type_to_glsl(tmp);

		if (splat)
		{
			res += convert_to_string(c.scalar_i64(vector, 0), int64_type, backend.long_long_literal_suffix);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_to_string(c.scalar_i64(vector, i), int64_type, backend.long_long_literal_suffix);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;
	}

	case SPIRType::UInt64:
		if (splat)
		{
			res += convert_to_string(c.scalar_u64(vector, 0));
			if (backend.long_long_literal_suffix)
				res += "ull";
			else
				res += "ul";
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += convert_to_string(c.scalar_u64(vector, i));
					if (backend.long_long_literal_suffix)
						res += "ull";
					else
						res += "ul";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::UInt:
		if (splat)
		{
			res += convert_to_string(c.scalar(vector, 0));
			if (is_legacy() && !has_extension("GL_EXT_gpu_shader4"))
			{
				// Fake unsigned constant literals with signed ones if possible.
				// Things like array sizes, etc, tend to be unsigned even though they could just as easily be signed.
				if (c.scalar_i32(vector, 0) < 0)
					SPIRV_CROSS_THROW("Tried to convert uint literal into int, but this made the literal negative.");
			}
			else if (backend.uint32_t_literal_suffix)
				res += "u";
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += convert_to_string(c.scalar(vector, i));
					if (is_legacy() && !has_extension("GL_EXT_gpu_shader4"))
					{
						// Fake unsigned constant literals with signed ones if possible.
						// Things like array sizes, etc, tend to be unsigned even though they could just as easily be signed.
						if (c.scalar_i32(vector, i) < 0)
							SPIRV_CROSS_THROW("Tried to convert uint literal into int, but this made "
							                  "the literal negative.");
					}
					else if (backend.uint32_t_literal_suffix)
						res += "u";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Int:
		if (splat)
			res += convert_to_string(c.scalar_i32(vector, 0));
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_to_string(c.scalar_i32(vector, i));
				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::UShort:
		if (splat)
		{
			res += convert_to_string(c.scalar(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					if (*backend.uint16_t_literal_suffix)
					{
						res += convert_to_string(c.scalar_u16(vector, i));
						res += backend.uint16_t_literal_suffix;
					}
					else
					{
						// If backend doesn't have a literal suffix, we need to value cast.
						res += type_to_glsl(scalar_type);
						res += "(";
						res += convert_to_string(c.scalar_u16(vector, i));
						res += ")";
					}
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Short:
		if (splat)
		{
			res += convert_to_string(c.scalar_i16(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					if (*backend.int16_t_literal_suffix)
					{
						res += convert_to_string(c.scalar_i16(vector, i));
						res += backend.int16_t_literal_suffix;
					}
					else
					{
						// If backend doesn't have a literal suffix, we need to value cast.
						res += type_to_glsl(scalar_type);
						res += "(";
						res += convert_to_string(c.scalar_i16(vector, i));
						res += ")";
					}
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::UByte:
		if (splat)
		{
			res += convert_to_string(c.scalar_u8(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += type_to_glsl(scalar_type);
					res += "(";
					res += convert_to_string(c.scalar_u8(vector, i));
					res += ")";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::SByte:
		if (splat)
		{
			res += convert_to_string(c.scalar_i8(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += type_to_glsl(scalar_type);
					res += "(";
					res += convert_to_string(c.scalar_i8(vector, i));
					res += ")";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Boolean:
		if (splat)
			res += c.scalar(vector, 0) ? "true" : "false";
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += c.scalar(vector, i) ? "true" : "false";

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	default:
		SPIRV_CROSS_THROW("Invalid constant expression basetype.");
	}

	if (c.vector_size() > 1 && !swizzle_splat)
		res += ")";

	return res;
}